

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O3

int AF_A_KoraxCommand(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  PClassActor *type;
  AActor *ent;
  char *__assertion;
  bool bVar8;
  DVector3 pos;
  FSoundID local_50;
  FName local_4c;
  DAngle local_48;
  DVector3 local_40;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e55a6;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_005e53e0:
        ent = (AActor *)0x0;
      }
      else {
        pPVar7 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
          (ent->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar8 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar3 && bVar8) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar3) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar8) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e55a6;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e54a0;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e5596;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar7 = (PClass *)puVar2[1];
            if (pPVar7 == (PClass *)0x0) {
              pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar7;
            }
            bVar8 = pPVar7 != (PClass *)0x0;
            if (pPVar7 != pPVar3 && bVar8) {
              do {
                pPVar7 = pPVar7->ParentClass;
                bVar8 = pPVar7 != (PClass *)0x0;
                if (pPVar7 == pPVar3) break;
              } while (pPVar7 != (PClass *)0x0);
            }
            if (!bVar8) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e55a6;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e5596;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e54a0:
        local_50.ID = S_FindSound("KoraxCommand");
        S_Sound(ent,2,&local_50,1.0,1.0);
        local_48.Degrees = (ent->Angles).Yaw.Degrees + -90.0;
        AActor::Vec3Angle(&local_40,ent,27.0,&local_48,120.0,false);
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"KoraxBolt",false);
        type = ClassForSpawn(&local_4c);
        AActor::StaticSpawn(type,&local_40,ALLOW_REPLACE,false);
        iVar4 = ent->health;
        iVar5 = AActor::SpawnHealth(ent);
        uVar6 = FRandom::GenRand32(&pr_koraxcommand);
        P_StartScript(ent,(line_t *)0x0,
                      (byte)(((ushort)uVar6 & 0xff) % (ushort)(iVar5 >> 1 < iVar4 ^ 5)) + 0xfa,
                      (char *)0x0,(int *)0x0,0,0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e55a6;
    }
    if (ent == (AActor *)0x0) goto LAB_005e53e0;
  }
LAB_005e5596:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e55a6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxCommand)
{
	PARAM_ACTION_PROLOGUE;
	DAngle ang;
	int numcommands;

	S_Sound (self, CHAN_VOICE, "KoraxCommand", 1, ATTN_NORM);

	// Shoot stream of lightning to ceiling
	ang = self->Angles.Yaw - 90;
	DVector3 pos = self->Vec3Angle(KORAX_COMMAND_OFFSET, ang, KORAX_COMMAND_HEIGHT);
	Spawn("KoraxBolt", pos, ALLOW_REPLACE);

	if (self->health <= (self->SpawnHealth() >> 1))
	{
		numcommands = 5;
	}
	else
	{
		numcommands = 4;
	}

	P_StartScript (self, NULL, 250+(pr_koraxcommand()%numcommands), NULL, NULL, 0, 0);
	return 0;
}